

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O0

int __thiscall irwincolor::Map::load(Map *this,string *file,string *name)

{
  pointer *this_00;
  value_type vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  char_t *pcVar7;
  unspecified_bool_type p_Var8;
  XPathException *pXVar9;
  reference pvVar10;
  ulong uVar11;
  size_type sVar12;
  reference pvVar13;
  ostream *poVar14;
  void *pvVar15;
  reference pvVar16;
  reference pvVar17;
  xpath_node xVar18;
  type_error *e;
  exception *e_1;
  int i_5;
  value_type cxmax;
  value_type cxmin;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  vector<double,_std::allocator<double>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idxc;
  type_error *e_5;
  exception *e_6;
  vector<float,_std::allocator<float>_> nan_1;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  uint local_60c;
  undefined1 local_608 [4];
  uint j;
  vector<float,_std::allocator<float>_> xrgb;
  uint local_5dc;
  uint i;
  exception *e_4;
  json inj;
  ifstream ifs;
  exception *e_3;
  xml_attribute local_3a8;
  string local_3a0;
  allocator<char> local_379;
  xml_attribute local_378;
  string local_370;
  allocator<char> local_349;
  xml_attribute local_348;
  string local_340;
  xml_node local_320;
  xml_node nan;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  exception *e_2;
  allocator<char> local_2b1;
  xml_attribute local_2b0;
  string local_2a8;
  double local_288;
  allocator<char> local_279;
  xml_attribute local_278;
  string local_270;
  double local_250;
  allocator<char> local_241;
  xml_attribute local_240;
  string local_238;
  double local_218;
  allocator<char> local_209;
  xml_attribute local_208;
  string local_200;
  double local_1e0;
  xml_node local_1d8;
  xml_node point;
  xml_node local_1c8;
  xml_attribute local_1c0;
  xpath_node local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 auStack_168 [8];
  xpath_node point0;
  string local_150 [8];
  string xquery;
  undefined1 local_128 [4];
  int io;
  xml_document doc;
  string ext;
  string *name_local;
  string *file_local;
  Map *this_local;
  
  std::vector<double,_std::allocator<double>_>::clear(&this->x);
  std::vector<double,_std::allocator<double>_>::clear(&this->r);
  std::vector<double,_std::allocator<double>_>::clear(&this->g);
  std::vector<double,_std::allocator<double>_>::clear(&this->b);
  this->nanr = 0.0;
  this->nang = 0.0;
  this->nanb = 0.0;
  std::__cxx11::string::operator=((string *)&this->space,"RGB");
  this->paraView = true;
  std::__cxx11::string::find_last_of((char *)file,0x187f55);
  std::__cxx11::string::substr((ulong)(doc._memory + 0xb8),(ulong)file);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (doc._memory + 0xb8),"xml");
  if (!bVar5) {
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (doc._memory + 0xb8),"json");
    if (bVar5) {
      std::ifstream::ifstream(&inj.m_value,(string *)file,_S_in);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&e_4,(nullptr_t)0x0);
      nlohmann::operator>>
                ((istream *)&inj.m_value.boolean,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&e_4);
      std::ifstream::close();
      local_5dc = 0;
LAB_00117cad:
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&e_4,(ulong)local_5dc);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"Name");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,name);
      bVar5 = nlohmann::operator!=
                        (pvVar10,(const_reference)
                                 &xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&xrgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      if (bVar5) goto LAB_00117d2f;
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&e_4,(ulong)local_5dc);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"RGBPoints");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator_vector<std::vector<float,_std::allocator<float>_>,_0>
                ((vector<float,_std::allocator<float>_> *)local_608,pvVar10);
      local_60c = 0;
      while (uVar11 = (ulong)local_60c,
            sVar12 = std::vector<float,_std::allocator<float>_>::size
                               ((vector<float,_std::allocator<float>_> *)local_608), uVar11 < sVar12
            ) {
        uVar11 = (ulong)local_60c;
        local_60c = local_60c + 1;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_608,uVar11);
        local_618 = (double)*pvVar13;
        std::vector<double,_std::allocator<double>_>::push_back(&this->x,&local_618);
        uVar11 = (ulong)local_60c;
        local_60c = local_60c + 1;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_608,uVar11);
        local_620 = (double)*pvVar13;
        std::vector<double,_std::allocator<double>_>::push_back(&this->r,&local_620);
        uVar11 = (ulong)local_60c;
        local_60c = local_60c + 1;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_608,uVar11);
        local_628 = (double)*pvVar13;
        std::vector<double,_std::allocator<double>_>::push_back(&this->g,&local_628);
        uVar11 = (ulong)local_60c;
        local_60c = local_60c + 1;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_608,uVar11);
        local_630 = (double)*pvVar13;
        std::vector<double,_std::allocator<double>_>::push_back(&this->b,&local_630);
      }
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&e_4,(ulong)local_5dc);
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar10,"ColorSpace");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &nan_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar10);
      this_00 = &nan_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::operator=((string *)&this->space,(string *)this_00);
      std::__cxx11::string::~string((string *)this_00);
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&e_4,(ulong)local_5dc);
      bVar5 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[9],_0>(pvVar10,(char (*) [9])"NanColor");
      if (bVar5) {
        pvVar10 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&e_4,(ulong)local_5dc);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar10,"NanColor");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator_vector<std::vector<float,_std::allocator<float>_>,_0>
                  ((vector<float,_std::allocator<float>_> *)&e_6,pvVar10);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&e_6,0);
        this->nanr = (double)*pvVar13;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&e_6,1);
        this->nang = (double)*pvVar13;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&e_6,2);
        this->nanb = (double)*pvVar13;
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)&e_6);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_608);
      xquery.field_2._8_4_ = 0;
      goto LAB_001181d8;
    }
    poVar14 = std::operator<<((ostream *)&std::cout,"\nError:  unknown colormap file extension \".")
    ;
    poVar14 = std::operator<<(poVar14,(string *)(doc._memory + 0xb8));
    poVar14 = std::operator<<(poVar14,"\".");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0xfffffffa;
    xquery.field_2._8_4_ = 1;
    goto LAB_0011882f;
  }
  pugi::xml_document::xml_document((xml_document *)local_128);
  iVar6 = loadXml(file,(xml_document *)local_128);
  xquery.field_2._12_4_ = ZEXT14(iVar6 != 0);
  if (xquery.field_2._12_4_ == 0) {
    std::__cxx11::string::string(local_150);
    pugi::xpath_node::xpath_node((xpath_node *)auStack_168);
    std::operator+(&local_1a8,"/ColorMaps/ColorMap[@name=\'",name);
    std::operator+(&local_188,&local_1a8,"\']/Point");
    std::__cxx11::string::operator=(local_150,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    pcVar7 = (char_t *)std::__cxx11::string::c_str();
    local_1b8 = pugi::xml_node::select_node((xml_node *)local_128,pcVar7,(xpath_variable_set *)0x0);
    point0._node._root = (xml_node_struct *)local_1b8._attribute._attr;
    auStack_168 = (undefined1  [8])local_1b8._node._root;
    bVar5 = pugi::xpath_node::operator!((xpath_node *)auStack_168);
    if (bVar5) {
      pXVar9 = (XPathException *)__cxa_allocate_exception(8);
      XPathException::XPathException(pXVar9,(XPathException *)&xPathException);
      __cxa_throw(pXVar9,&XPathException::typeinfo,XPathException::~XPathException);
    }
    point = pugi::xpath_node::node((xpath_node *)auStack_168);
    local_1c8 = pugi::xml_node::parent(&point);
    local_1c0 = pugi::xml_node::attribute(&local_1c8,"space");
    pcVar7 = pugi::xml_attribute::value(&local_1c0);
    std::__cxx11::string::operator=((string *)&this->space,pcVar7);
    local_1d8 = pugi::xpath_node::node((xpath_node *)auStack_168);
    while( true ) {
      p_Var8 = pugi::xml_node::operator_cast_to_function_pointer(&local_1d8);
      if (p_Var8 == (unspecified_bool_type)0x0) break;
      local_208 = pugi::xml_node::attribute(&local_1d8,"x");
      pcVar7 = pugi::xml_attribute::value(&local_208);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pcVar7,&local_209);
      local_1e0 = std::__cxx11::stod(&local_200,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::push_back(&this->x,&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_209);
      local_240 = pugi::xml_node::attribute(&local_1d8,"r");
      pcVar7 = pugi::xml_attribute::value(&local_240);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar7,&local_241);
      local_218 = std::__cxx11::stod(&local_238,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::push_back(&this->r,&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_241);
      local_278 = pugi::xml_node::attribute(&local_1d8,"g");
      pcVar7 = pugi::xml_attribute::value(&local_278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar7,&local_279);
      local_250 = std::__cxx11::stod(&local_270,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::push_back(&this->g,&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_279);
      local_2b0 = pugi::xml_node::attribute(&local_1d8,"b");
      pcVar7 = pugi::xml_attribute::value(&local_2b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar7,&local_2b1);
      local_288 = std::__cxx11::stod(&local_2a8,(size_t *)0x0);
      std::vector<double,_std::allocator<double>_>::push_back(&this->b,&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2b1);
      e_2 = (exception *)pugi::xml_node::next_sibling(&local_1d8,"Point");
      local_1d8 = (xml_node)e_2;
    }
    std::operator+(&local_308,"/ColorMaps/ColorMap[@name=\'",name);
    std::operator+(&local_2e8,&local_308,"\']/NaN");
    std::__cxx11::string::operator=(local_150,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    pcVar7 = (char_t *)std::__cxx11::string::c_str();
    xVar18 = pugi::xml_node::select_node((xml_node *)local_128,pcVar7,(xpath_variable_set *)0x0);
    point0._node._root = (xml_node_struct *)xVar18._attribute._attr;
    nan = xVar18._node._root;
    auStack_168 = (undefined1  [8])nan._root;
    bVar5 = pugi::xpath_node::operator!((xpath_node *)auStack_168);
    if (bVar5) {
      pXVar9 = (XPathException *)__cxa_allocate_exception(8);
      XPathException::XPathException(pXVar9,(XPathException *)&xPathException);
      __cxa_throw(pXVar9,&XPathException::typeinfo,XPathException::~XPathException);
    }
    local_320 = pugi::xpath_node::node((xpath_node *)auStack_168);
    local_348 = pugi::xml_node::attribute(&local_320,"r");
    pcVar7 = pugi::xml_attribute::value(&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,pcVar7,&local_349);
    dVar2 = std::__cxx11::stod(&local_340,(size_t *)0x0);
    this->nanr = dVar2;
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_349);
    local_378 = pugi::xml_node::attribute(&local_320,"g");
    pcVar7 = pugi::xml_attribute::value(&local_378);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar7,&local_379);
    dVar2 = std::__cxx11::stod(&local_370,(size_t *)0x0);
    this->nang = dVar2;
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_379);
    local_3a8 = pugi::xml_node::attribute(&local_320,"b");
    pcVar7 = pugi::xml_attribute::value(&local_3a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,pcVar7,(allocator<char> *)((long)&e_3 + 7));
    dVar2 = std::__cxx11::stod(&local_3a0,(size_t *)0x0);
    this->nanb = dVar2;
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
    xquery.field_2._8_4_ = 0;
    std::__cxx11::string::~string(local_150);
  }
  else {
    xquery.field_2._8_4_ = 1;
    this_local._4_4_ = xquery.field_2._12_4_;
  }
  pugi::xml_document::~xml_document((xml_document *)local_128);
  goto joined_r0x00117ae1;
LAB_00117d2f:
  local_5dc = local_5dc + 1;
  sVar12 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&e_4);
  if (sVar12 <= local_5dc) goto code_r0x00117d66;
  goto LAB_00117cad;
code_r0x00117d66:
  poVar14 = std::operator<<((ostream *)&std::cout,"\nError:  cannot find colormap name \"");
  poVar14 = std::operator<<(poVar14,(string *)name);
  poVar14 = std::operator<<(poVar14,"\".");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  this_local._4_4_ = 0xfffffffe;
  xquery.field_2._8_4_ = 1;
LAB_001181d8:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&e_4);
  std::ifstream::~ifstream(&inj.m_value);
joined_r0x00117ae1:
  if (xquery.field_2._8_4_ == 0) {
    poVar14 = std::operator<<((ostream *)&std::cout,"NaN RGB = ");
    pvVar15 = (void *)std::ostream::operator<<(poVar14,this->nanr);
    pvVar15 = (void *)std::ostream::operator<<(pvVar15,this->nang);
    poVar14 = (ostream *)std::ostream::operator<<(pvVar15,this->nanb);
    std::operator<<(poVar14,"\n");
    poVar14 = std::operator<<((ostream *)&std::cout,"Colormap space = ");
    poVar14 = std::operator<<(poVar14,(string *)&this->space);
    std::operator<<(poVar14,"\n");
    poVar14 = std::operator<<((ostream *)&std::cout,"Number of interpolation points = ");
    sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->x);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,sVar12);
    std::operator<<(poVar14,"\n");
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    sortidx<double>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&this->x);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&i_2);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&i_2,&this->x);
    i_3 = 0;
    while( true ) {
      sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->x);
      if (sVar12 <= (ulong)(long)i_3) break;
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)i_3);
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i_2,(ulong)*pvVar16);
      vVar1 = *pvVar17;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,(long)i_3);
      *pvVar17 = vVar1;
      i_3 = i_3 + 1;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&i_2,&this->r);
    i_4 = 0;
    while( true ) {
      sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->r);
      if (sVar12 <= (ulong)(long)i_4) break;
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)i_4);
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i_2,(ulong)*pvVar16);
      vVar1 = *pvVar17;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->r,(long)i_4);
      *pvVar17 = vVar1;
      i_4 = i_4 + 1;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&i_2,&this->g);
    cxmin._4_4_ = 0;
    while( true ) {
      sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->g);
      if (sVar12 <= (ulong)(long)cxmin._4_4_) break;
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)cxmin._4_4_);
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i_2,(ulong)*pvVar16);
      vVar1 = *pvVar17;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->g,(long)cxmin._4_4_)
      ;
      *pvVar17 = vVar1;
      cxmin._4_4_ = cxmin._4_4_ + 1;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&i_2,&this->b);
    cxmin._0_4_ = 0;
    while( true ) {
      sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->b);
      if (sVar12 <= (ulong)(long)cxmin._0_4_) break;
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)cxmin._0_4_);
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i_2,(ulong)*pvVar16);
      vVar1 = *pvVar17;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->b,(long)cxmin._0_4_)
      ;
      *pvVar17 = vVar1;
      cxmin._0_4_ = cxmin._0_4_ + 1;
    }
    pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
    dVar2 = *pvVar17;
    sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->x);
    pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,sVar12 - 1);
    dVar3 = *pvVar17;
    e_1._4_4_ = 0;
    while( true ) {
      sVar12 = std::vector<double,_std::allocator<double>_>::size(&this->x);
      if (sVar12 <= (ulong)(long)e_1._4_4_) break;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,(long)e_1._4_4_);
      dVar4 = *pvVar17;
      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,(long)e_1._4_4_);
      *pvVar17 = (dVar4 - dVar2) / (dVar3 - dVar2);
      e_1._4_4_ = e_1._4_4_ + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&i_2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    xquery.field_2._8_4_ = 0;
  }
LAB_0011882f:
  std::__cxx11::string::~string((string *)(doc._memory + 0xb8));
  if (xquery.field_2._8_4_ == 0) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int load(std::string file, std::string name)
	{ try {
		x.clear();
		r.clear();
		g.clear();
		b.clear();
		nanr = 0;
		nang = 0;
		nanb = 0;
		space = "RGB";
		paraView = true;

		std::string ext = file.substr(file.find_last_of(".") + 1);
		if (ext == "xml")
		{
			pugi::xml_document doc;
			if (int io = loadXml(file, doc) != 0)
				return io;

			std::string xquery;
			pugi::xpath_node point0;
			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/Point";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				//std::cout << "point0 = " << point0.node().first_attribute().value() << "\n";
				space = point0.node().parent().attribute("space").value();
				for (pugi::xml_node point = point0.node(); point; point = point.next_sibling("Point"))
				{
					//std::cout << "b = " << point.attribute("b").value() << std::endl;
					x.push_back(std::stod(point.attribute("x").value()));
					r.push_back(std::stod(point.attribute("r").value()));
					g.push_back(std::stod(point.attribute("g").value()));
					b.push_back(std::stod(point.attribute("b").value()));
				}
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot parse colormap \"" << name << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_XML_PARSE;
			}

			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/NaN";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				pugi::xml_node nan = point0.node();
				nanr = std::stod(nan.attribute("r").value());
				nang = std::stod(nan.attribute("g").value());
				nanb = std::stod(nan.attribute("b").value());
			}
			catch (const std::exception& e)
			{
				// Do nothing.  Use default NaN color.
			}
		}
		else if (ext == "json")
		{
			std::ifstream ifs(file);
			json inj;

			try
			{
				ifs >> inj;
				ifs.close();  // close to release lock on file
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot load JSON colormap file \"" << file << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_JSON;
			}

			//std::cout << "Input JSON =\n" << std::setw(4) << inj << "\n" << std::endl;

			unsigned int i = 0;
			while (inj[i]["Name"] != name)
			{
				i++;
				if (i >= inj.size())
				{
					std::cout << "\nError:  cannot find colormap name \"" << name << "\"." << std::endl;
					return ERR_JSON;
				}
			}

			//std::string name0 = inj[i]["Name"];
			//std::cout << "name0 = " << name0 << std::endl;

			std::vector<float> xrgb = inj[i]["RGBPoints"];
			//std::cout << "xrgb = " << xrgb << std::endl;
			for (unsigned int j = 0; j < xrgb.size();)
			{
				x.push_back(xrgb[j++]);
				r.push_back(xrgb[j++]);
				g.push_back(xrgb[j++]);
				b.push_back(xrgb[j++]);
			}

			space = inj[i]["ColorSpace"];

			if (inj[i].contains("NanColor"))
			{
				//std::cout << "contains NanColor\n\n";

				try
				{
					std::vector<float> nan = inj[i]["NanColor"];
					nanr = nan[0];
					nang = nan[1];
					nanb = nan[2];
				}
				catch (const nlohmann::detail::type_error& e)
				{
				}
				catch (const std::exception& e)
				{
					// Do nothing.  Use default NaN color.
				}
			}
			//else
			//{
			//	std::cout << "does not contain NanColor\n\n";
			//}

		}
		else
		{
			std::cout << "\nError:  unknown colormap file extension \"." << ext << "\"." << std::endl;
			return ERR_FILETYPE;
		}

		std::cout << "NaN RGB = " << nanr << nang << nanb << "\n";
		std::cout << "Colormap space = " << space << "\n";
		std::cout << "Number of interpolation points = " << x.size() << "\n";
		std::cout << std::endl;

		// Sort by x.
		auto idxc = sortidx(x);
		std::vector<double> tmp;
		tmp = x;
		for (int i = 0; i < x.size(); i++)
			x[i] = tmp[idxc[i]];
		tmp = r;
		for (int i = 0; i < r.size(); i++)
			r[i] = tmp[idxc[i]];
		tmp = g;
		for (int i = 0; i < g.size(); i++)
			g[i] = tmp[idxc[i]];
		tmp = b;
		for (int i = 0; i < b.size(); i++)
			b[i] = tmp[idxc[i]];

		// Map x to range [0, 1], since some XMLs use [-1, 1] instead.
		auto cxmin = x[0];
		auto cxmax = x[x.size() - 1];
		for (int i = 0; i < x.size(); i++)
			x[i] = (x[i] - cxmin) / (cxmax - cxmin);

		//std::cout << "Color map:\n";
		//for (int i = 0; i < x.size(); i++)
		//{
		//	std::cout << "x = " << x[i] << ", r = " << r[i]
		//	        << ", g = " << g[i] << ", b = " << b[i] << "\n";
		//}

		}
		catch (const nlohmann::detail::type_error& e)
		{
		}
		catch (const std::exception& e)
		{
			// Do nothing.  Use default NaN color.
		}

		return 0;
	}